

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_keyexpimp.c
# Opt level: O0

int magma_wrap_do(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  long lVar2;
  ulong in_RCX;
  void *in_RDX;
  long in_RSI;
  undefined8 in_RDI;
  int enc;
  GOST_WRAP_CTX *cctx;
  int in_stack_00000054;
  size_t in_stack_00000058;
  uchar *in_stack_00000060;
  uchar *in_stack_00000070;
  size_t in_stack_00000078;
  uchar *in_stack_00000080;
  int local_4;
  
  lVar2 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
  if (in_RSI == 0) {
    local_4 = 0x20;
  }
  else {
    if (in_RCX < 0x29) {
      if (0x28 < *(long *)(lVar2 + 0x78) + in_RCX) {
        return -1;
      }
      if (*(long *)(lVar2 + 0x78) + in_RCX < 0x29) {
        memcpy((void *)(lVar2 + 0x48 + *(long *)(lVar2 + 0x78)),in_RDX,in_RCX);
        *(ulong *)(lVar2 + 0x78) = in_RCX + *(long *)(lVar2 + 0x78);
      }
    }
    if (*(ulong *)(lVar2 + 0x78) < 0x28) {
      local_4 = 0;
    }
    else if (iVar1 == 0) {
      iVar1 = gost_kimp15(in_stack_00000060,in_stack_00000058,in_stack_00000054,(uchar *)ctx,
                          out._4_4_,in,in_stack_00000070,in_stack_00000078,in_stack_00000080);
      local_4 = 0;
      if (0 < iVar1) {
        local_4 = 0x20;
      }
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int magma_wrap_do(EVP_CIPHER_CTX *ctx, unsigned char *out,
	const unsigned char *in, size_t inl)
{
	GOST_WRAP_CTX *cctx = EVP_CIPHER_CTX_get_cipher_data(ctx);
	int enc = EVP_CIPHER_CTX_encrypting(ctx) ? 1 : 0;

	if (out == NULL)
		return GOSTKEYLEN;

	if (inl <= MAGMA_WRAPPED_KEY_LEN) {
		if (cctx->wrap_count + inl > MAGMA_WRAPPED_KEY_LEN)
			return -1;

		if (cctx->wrap_count + inl <= MAGMA_WRAPPED_KEY_LEN)
		{
			memcpy(cctx->wrapped+cctx->wrap_count, in, inl);
			cctx->wrap_count += inl;
		}
	}

	if (cctx->wrap_count < MAGMA_WRAPPED_KEY_LEN)
		return 0;

	if (enc) {
#if 0
		return gost_kexp15(cctx->key, 32, NID_magma_ctr, in, NID_magma_mac,
			cctx->key, /* FIXME mac_key, */ cctx->iv, 4, out, &outl);
#endif
		return -1;
	} else {
		return gost_kimp15(cctx->wrapped, cctx->wrap_count, NID_magma_ctr,
		cctx->key+GOSTKEYLEN, NID_magma_mac, cctx->key, cctx->iv, 4, out) > 0 ? GOSTKEYLEN : 0;
	}
}